

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

void __thiscall SoftHSM::~SoftHSM(SoftHSM *this)

{
  undefined8 *in_RDI;
  list<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  
  *in_RDI = &PTR__SoftHSM_00220cd0;
  if ((in_RDI[6] != 0) && ((long *)in_RDI[6] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[6] + 8))();
  }
  in_RDI[6] = 0;
  if ((in_RDI[5] != 0) && ((long *)in_RDI[5] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[5] + 8))();
  }
  in_RDI[5] = 0;
  if ((in_RDI[4] != 0) && ((long *)in_RDI[4] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[4] + 8))();
  }
  in_RDI[4] = 0;
  if ((in_RDI[3] != 0) &&
     (in_stack_ffffffffffffffd0 = (list<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI[3],
     in_stack_ffffffffffffffd0 != (list<unsigned_long,_std::allocator<unsigned_long>_> *)0x0)) {
    (*(code *)((in_stack_ffffffffffffffd0->
               super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node.
               super__List_node_base._M_next)->_M_prev)();
  }
  in_RDI[3] = 0;
  if ((in_RDI[2] != 0) && ((long *)in_RDI[2] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[2] + 8))();
  }
  in_RDI[2] = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *)0x15ba71);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (in_stack_ffffffffffffffd0);
  *(undefined1 *)(in_RDI + 1) = 0;
  resetMutexFactoryCallbacks();
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x15ba9d);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)0x15baab);
  return;
}

Assistant:

SoftHSM::~SoftHSM()
{
	if (handleManager != NULL) delete handleManager;
	handleManager = NULL;
	if (sessionManager != NULL) delete sessionManager;
	sessionManager = NULL;
	if (slotManager != NULL) delete slotManager;
	slotManager = NULL;
	if (objectStore != NULL) delete objectStore;
	objectStore = NULL;
	if (sessionObjectStore != NULL) delete sessionObjectStore;
	sessionObjectStore = NULL;

	mechanisms_table.clear();
	supportedMechanisms.clear();

	isInitialised = false;

	resetMutexFactoryCallbacks();
}